

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O3

void __thiscall SO3LimitMap::test_method(SO3LimitMap *this)

{
  double *pdVar1;
  size_t size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  size_t sVar2;
  Index outer_stride;
  VectorXd expectedRes;
  double *local_1b8;
  size_t local_1b0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1a8;
  undefined **local_188;
  undefined1 local_180;
  undefined8 *local_178;
  char *local_170;
  Scalar local_168;
  double **local_160;
  undefined1 *local_158;
  undefined1 local_150 [8];
  undefined8 local_148;
  shared_count sStack_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  double *local_108;
  size_t local_100;
  SO3<mnf::ExpMapQuaternion> S;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  double ***local_38;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  size = mnf::Manifold::dim();
  local_1b8 = (double *)0x0;
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (size != 0) {
    local_1b8 = Eigen::internal::conditional_aligned_new_auto<double,true>(size);
  }
  pdVar1 = local_1b8;
  local_1b0 = size;
  local_108 = local_1b8;
  local_100 = size;
  mnf::Manifold::limitMap(&S);
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if (size == 0) {
    expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         size;
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(size);
  local_168 = 1.8137993642342178;
  local_1a8.m_row = 0;
  local_1a8.m_col = 1;
  local_1a8.m_currentBlockRows = 1;
  *expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       1.8137993642342178;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = size
  ;
  local_1a8.m_xpr = &expectedRes;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_1a8,&local_168);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&local_168);
  if ((local_1a8.m_currentBlockRows + local_1a8.m_row !=
       ((local_1a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
       .m_rows) || (local_1a8.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x7f);
  local_180 = 0;
  local_188 = &PTR__lazy_ostream_00134ac0;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  if (expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      size) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  sVar2 = 0;
  while( true ) {
    if ((expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         [sVar2] != pdVar1[sVar2]) ||
       (NAN(expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[sVar2]) || NAN(pdVar1[sVar2]))) break;
    sVar2 = sVar2 + 1;
    if (size == sVar2) {
      local_150[0] = 1;
LAB_0011589c:
      local_148 = 0;
      sStack_140.pi_ = (sp_counted_base *)0x0;
      local_118 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
      ;
      local_110 = "";
      local_1a8.m_currentBlockRows = (Index)&local_158;
      local_1a8.m_row = local_1a8.m_row & 0xffffffffffffff00;
      local_1a8.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&PTR__lazy_ostream_00134c50;
      local_1a8.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
      local_160 = &local_1b8;
      local_38 = &local_160;
      local_48 = 0;
      local_50 = &PTR__lazy_ostream_00134c50;
      local_40 = &boost::unit_test::lazy_ostream::inst;
      local_158 = (undefined1 *)&expectedRes;
      boost::test_tools::tt_detail::report_assertion
                (local_150,&local_188,&local_118,0x7f,1,2,2,"expectedRes",&local_1a8,"res",&local_50
                );
      boost::detail::shared_count::~shared_count(&sStack_140);
      free(expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_1b8);
      S._0_8_ = &PTR__SO3_00134718;
      mnf::ReusableTemporaryMap::~ReusableTemporaryMap(&S.bufferMap_);
      mnf::Manifold::~Manifold(&S.super_Manifold);
      return;
    }
  }
  local_150[0] = 0;
  goto LAB_0011589c;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3LimitMap)
{
  SO3<ExpMapQuaternion> S;
  Index dim = S.dim();
  Eigen::VectorXd res(dim);
  S.limitMap(res);
  Eigen::VectorXd expectedRes(dim);
  double i = M_PI / sqrt(3);
  expectedRes << i, i, i;
  BOOST_CHECK_EQUAL(expectedRes, res);
}